

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O1

void fast_forward_start_bits(compiler_common *common)

{
  uint8_t uVar1;
  int iVar2;
  sljit_compiler *compiler;
  pcre2_real_code_16 *ppVar3;
  BOOL BVar4;
  sljit_u8 *psVar5;
  sljit_label *psVar6;
  sljit_jump *psVar7;
  jump_list *pjVar8;
  sljit_jump *psVar9;
  byte *pbVar10;
  sljit_jump *psVar11;
  sljit_sw srcw;
  jump_list *matches;
  
  compiler = common->compiler;
  ppVar3 = common->re;
  matches = (jump_list *)0x0;
  iVar2 = common->match_end_ptr;
  if ((long)iVar2 != 0) {
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar5 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar2);
      if (psVar5 != (sljit_u8 *)0x0) {
        *psVar5 = 0x8b;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar5 = emit_x86_instruction(compiler,1,0xd,0,5,0);
      if (psVar5 != (sljit_u8 *)0x0) {
        *psVar5 = 0x89;
      }
    }
    srcw = 1;
    sljit_emit_op2(compiler,0x60,1,0,1,0,0x40,2);
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      srcw = 1;
      psVar5 = emit_x86_instruction(compiler,1,0xd,0,1,0);
      if (psVar5 != (sljit_u8 *)0x0) {
        *psVar5 = ';';
      }
    }
    sljit_emit_cmov(compiler,4,0xd,1,srcw);
  }
  psVar6 = sljit_emit_label(compiler);
  psVar7 = sljit_emit_cmp(compiler,3,2,0,0xd,0);
  if (common->mode == 1) {
    if (compiler->error == 0) {
      pjVar8 = (jump_list *)ensure_abuf(compiler,0x10);
    }
    else {
      pjVar8 = (jump_list *)0x0;
    }
    if (pjVar8 != (jump_list *)0x0) {
      pjVar8->next = common->failed_match;
      pjVar8->jump = psVar7;
      common->failed_match = pjVar8;
    }
  }
  if (compiler->error == 0) {
    compiler->mode32 = 0;
    psVar5 = emit_x86_instruction(compiler,2,1,0,0x82,0);
    if (psVar5 != (sljit_u8 *)0x0) {
      psVar5[0] = '\x0f';
      psVar5[1] = 0xb7;
    }
  }
  sljit_emit_op2(compiler,0x60,2,0,2,0,0x40,2);
  BVar4 = optimize_class(common,ppVar3->start_bitmap,(uint)(ppVar3->start_bitmap[0x1f] >> 7),0,
                         &matches);
  if (BVar4 == 0) {
    uVar1 = ppVar3->start_bitmap[0x1f];
    psVar9 = sljit_emit_cmp(compiler,3,1,0,0x40,0xff);
    psVar11 = psVar9;
    if (((-1 < (char)uVar1) && (psVar11 = (sljit_jump *)0x0, psVar6 != (sljit_label *)0x0)) &&
       (psVar9 != (sljit_jump *)0x0)) {
      psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
      (psVar9->u).label = psVar6;
      psVar11 = (sljit_jump *)0x0;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      emit_cum_binary(compiler,0x25232120,4,0,1,0,0x40,7);
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      pbVar10 = emit_x86_instruction(compiler,0x21,0x40,3,1,0);
      if (pbVar10 != (byte *)0x0) {
        *pbVar10 = *pbVar10 | 0x28;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar5 = emit_x86_instruction(compiler,2,1,0,0x81,(sljit_sw)ppVar3->start_bitmap);
      if (psVar5 != (sljit_u8 *)0x0) {
        psVar5[0] = '\x0f';
        psVar5[1] = 0xb6;
      }
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      emit_shift(compiler,' ',3,0,0x40,1,4,0);
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar5 = emit_x86_instruction(compiler,1,1,0,3,0);
      if (psVar5 != (sljit_u8 *)0x0) {
        *psVar5 = 0x85;
      }
    }
    psVar9 = sljit_emit_jump(compiler,0);
    if ((psVar6 != (sljit_label *)0x0) && (psVar9 != (sljit_jump *)0x0)) {
      psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
      (psVar9->u).label = psVar6;
    }
  }
  else {
    psVar11 = (sljit_jump *)0x0;
    for (pjVar8 = matches; pjVar8 != (jump_list *)0x0; pjVar8 = pjVar8->next) {
      if ((psVar6 != (sljit_label *)0x0) && (psVar9 = pjVar8->jump, psVar9 != (sljit_jump *)0x0)) {
        psVar9->flags = (psVar9->flags & 0xfffffffffffffffcU) + 1;
        (psVar9->u).label = psVar6;
      }
    }
  }
  if ((psVar11 != (sljit_jump *)0x0) &&
     (psVar6 = sljit_emit_label(compiler), psVar6 != (sljit_label *)0x0)) {
    psVar11->flags = (psVar11->flags & 0xfffffffffffffffcU) + 1;
    (psVar11->u).label = psVar6;
  }
  sljit_emit_op2(compiler,0x62,2,0,2,0,0x40,2);
  if (((common->mode != 1) && (psVar6 = sljit_emit_label(compiler), psVar7 != (sljit_jump *)0x0)) &&
     (psVar6 != (sljit_label *)0x0)) {
    psVar7->flags = (psVar7->flags & 0xfffffffffffffffcU) + 1;
    (psVar7->u).label = psVar6;
  }
  if ((common->match_end_ptr != 0) && (compiler->error == 0)) {
    compiler->mode32 = 0;
    psVar5 = emit_x86_instruction(compiler,1,5,0,0xd,0);
    if (psVar5 != (sljit_u8 *)0x0) {
      *psVar5 = 0x89;
    }
  }
  return;
}

Assistant:

static SLJIT_INLINE void fast_forward_start_bits(compiler_common *common)
{
DEFINE_COMPILER;
const sljit_u8 *start_bits = common->re->start_bitmap;
struct sljit_label *start;
struct sljit_jump *partial_quit;
#if PCRE2_CODE_UNIT_WIDTH != 8
struct sljit_jump *found = NULL;
#endif
jump_list *matches = NULL;

if (common->match_end_ptr != 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->match_end_ptr);
  OP1(SLJIT_MOV, RETURN_ADDR, 0, STR_END, 0);
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, IN_UCHARS(1));
  OP2(SLJIT_SUB | SLJIT_SET_GREATER, SLJIT_UNUSED, 0, STR_END, 0, TMP1, 0);
  CMOV(SLJIT_GREATER, STR_END, TMP1, 0);
  }

start = LABEL();

partial_quit = CMP(SLJIT_GREATER_EQUAL, STR_PTR, 0, STR_END, 0);
if (common->mode == PCRE2_JIT_COMPLETE)
  add_jump(compiler, &common->failed_match, partial_quit);

OP1(MOV_UCHAR, TMP1, 0, SLJIT_MEM1(STR_PTR), 0);
OP2(SLJIT_ADD, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (!optimize_class(common, start_bits, (start_bits[31] & 0x80) != 0, FALSE, &matches))
  {
#if PCRE2_CODE_UNIT_WIDTH != 8
  if ((start_bits[31] & 0x80) != 0)
    found = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 255);
  else
    CMPTO(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, 255, start);
#elif defined SUPPORT_UNICODE
  if (common->utf && is_char7_bitset(start_bits, FALSE))
    CMPTO(SLJIT_GREATER, TMP1, 0, SLJIT_IMM, 127, start);
#endif
  OP2(SLJIT_AND, TMP2, 0, TMP1, 0, SLJIT_IMM, 0x7);
  OP2(SLJIT_LSHR, TMP1, 0, TMP1, 0, SLJIT_IMM, 3);
  OP1(SLJIT_MOV_U8, TMP1, 0, SLJIT_MEM1(TMP1), (sljit_sw)start_bits);
  if (sljit_get_register_index(TMP3) >= 0)
    {
    OP2(SLJIT_SHL, TMP3, 0, SLJIT_IMM, 1, TMP2, 0);
    OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP3, 0);
    }
  else
    {
    OP2(SLJIT_SHL, TMP2, 0, SLJIT_IMM, 1, TMP2, 0);
    OP2(SLJIT_AND | SLJIT_SET_Z, SLJIT_UNUSED, 0, TMP1, 0, TMP2, 0);
    }
  JUMPTO(SLJIT_ZERO, start);
  }
else
  set_jumps(matches, start);

#if PCRE2_CODE_UNIT_WIDTH != 8
if (found != NULL)
  JUMPHERE(found);
#endif

OP2(SLJIT_SUB, STR_PTR, 0, STR_PTR, 0, SLJIT_IMM, IN_UCHARS(1));

if (common->mode != PCRE2_JIT_COMPLETE)
  JUMPHERE(partial_quit);

if (common->match_end_ptr != 0)
  OP1(SLJIT_MOV, STR_END, 0, RETURN_ADDR, 0);
}